

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_queue.h
# Opt level: O2

void __thiscall
cppnet::ThreadSafeQueue<cppnet::Log_*>::Push(ThreadSafeQueue<cppnet::Log_*> *this,Log **element)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->_mutex);
  std::deque<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>::push_back(&(this->_queue).c,element);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void Push(const T& element) {
        std::unique_lock<std::mutex> lock(_mutex);
        _queue.push(element);
    }